

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

int __thiscall QMainWindowLayoutState::remove(QMainWindowLayoutState *this,char *__filename)

{
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (**(int **)(__filename + 8) == 1) {
    QList<int>::mid((QList<int> *)&local_30,(QList<int> *)__filename,1,-1);
    QDockAreaLayout::remove(&this->dockAreaLayout,(char *)&local_30);
  }
  else {
    if (**(int **)(__filename + 8) != 0) goto LAB_00400578;
    QList<int>::mid((QList<int> *)&local_30,(QList<int> *)__filename,1,-1);
    QToolBarAreaLayout::remove(&this->toolBarAreaLayout,(char *)&local_30);
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_30);
LAB_00400578:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::remove(const QList<int> &path)
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0)
        toolBarAreaLayout.remove(path.mid(1));
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        dockAreaLayout.remove(path.mid(1));
#endif // QT_CONFIG(dockwidget)
}